

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

int32 __thiscall nuraft::raft_server::get_quorum_for_commit(raft_server *this)

{
  int iVar1;
  undefined8 uVar2;
  int32 iVar3;
  _Hash_node_base *p_Var4;
  ptr<raft_params> params;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  context::get_params((context *)local_48);
  iVar3 = get_num_voting_members(this);
  if ((*(char *)((long)&((element_type *)(local_48._0_8_ + 0x50))->_vptr_state_mgr + 1) == '\x01')
     && (p_Var4 = (this->peers_)._M_h._M_before_begin._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
    do {
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        peer::get_snapshot_sync_ctx((peer *)(local_48 + 0x10));
        uVar2 = local_48._16_8_;
        if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
        }
        iVar3 = iVar3 + -1 + (uint)((element_type *)uVar2 == (element_type *)0x0);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  iVar1 = *(int *)&((element_type *)(local_48._0_8_ + 0x38))->_vptr_state_mgr;
  if ((iVar1 < 1) || (iVar3 < iVar1)) {
    iVar3 = iVar3 / 2;
  }
  else {
    iVar3 = iVar1 + -1;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return iVar3;
}

Assistant:

int32 raft_server::get_quorum_for_commit() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();

    if (params->exclude_snp_receiver_from_quorum_){
        // If the option is on, exclude any peer who is
        // receiving snapshot.
        for (auto& entry: peers_) {
            ptr<peer>& p = entry.second;
            if ( num_voting_members &&
                 p->get_snapshot_sync_ctx() ) {
                num_voting_members--;
            }
        }
    }

    if ( params->custom_commit_quorum_size_ <= 0 ||
         params->custom_commit_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_commit_quorum_size_ - 1;
}